

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O3

Integer pnga_sprs_array_get_column(Integer s_a,Integer icol)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  Integer *mapc;
  void *__s;
  Integer IVar5;
  long lVar6;
  long lVar7;
  _sparse_array *p_Var8;
  long lVar9;
  Integer IVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  char cplus [2];
  Integer ihi;
  Integer ilo;
  void *vptr;
  void *ptr;
  Integer nprocs;
  Integer idim;
  Integer ld;
  char local_d2 [2];
  Integer local_d0;
  Integer local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  Integer local_a8;
  Integer local_a0;
  long local_98;
  void *local_90;
  Integer local_88;
  long local_80;
  long local_78;
  Integer local_70;
  long local_68;
  Integer *local_60;
  long local_58;
  Integer local_50;
  Integer local_48;
  Integer local_40;
  Integer local_38;
  
  lVar11 = s_a + 1000;
  lVar12 = lVar11 * 200;
  local_a8 = SPA[lVar11].type;
  local_40 = SPA[lVar11].idim;
  local_88 = icol;
  local_50 = s_a;
  local_d0 = pnga_pgroup_nnodes(SPA[lVar11].grp);
  local_70 = local_d0;
  local_90 = (void *)pnga_pgroup_nodeid(SPA[lVar11].grp);
  local_d2[0] = '+';
  local_d2[1] = '\0';
  local_b0 = (long)_ga_sync_begin;
  local_58 = (long)_ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (local_b0 != 0) {
    pnga_pgroup_sync(SPA[lVar11].grp);
  }
  IVar10 = local_d0;
  p_Var8 = SPA;
  local_a0 = SPA[lVar11].ilo;
  local_c8 = SPA[lVar11].ihi;
  sVar1 = local_d0 * 8;
  __s = malloc(sVar1);
  local_60 = (Integer *)malloc(sVar1);
  if (0 < IVar10) {
    memset(__s,0,sVar1);
  }
  local_68 = local_c8 + 1;
  *(long *)((long)__s + (long)local_90 * 8) = local_68 - local_a0;
  pnga_pgroup_gop(p_Var8[lVar11].grp,0x3ea,__s,local_d0,local_d2);
  lVar4 = local_58;
  mapc = local_60;
  lVar6 = local_b0;
  *local_60 = 1;
  if (1 < local_70) {
    lVar7 = 1;
    lVar9 = 0;
    do {
      lVar7 = lVar7 + *(long *)((long)__s + lVar9 * 8);
      local_60[lVar9 + 1] = lVar7;
      lVar9 = lVar9 + 1;
    } while (local_70 + -1 != lVar9);
  }
  local_90 = __s;
  pnga_mask_sync(local_b0,local_58);
  IVar5 = pnga_create_handle();
  pnga_set_data(IVar5,1,&local_40,local_a8);
  pnga_set_pgroup(IVar5,SPA[lVar11].grp);
  pnga_set_irreg_distr(IVar5,mapc,&local_70);
  pnga_mask_sync(lVar6,lVar4);
  pnga_allocate(IVar5);
  pnga_mask_sync(lVar6,lVar4);
  pnga_zero(IVar5);
  IVar10 = local_a0;
  local_48 = IVar5;
  if (local_c8 < local_a0) {
    local_78 = 0;
  }
  else {
    local_b8 = local_a0 + 1;
    local_c0 = local_68;
    pnga_access_ptr(IVar5,&local_b8,&local_c0,&local_78,&local_38);
  }
  lVar6 = (local_70 * local_88) / SPA[lVar11].jdim;
  if (0 < SPA[lVar11].nblocks) {
    p_Var8 = SPA + lVar11;
    lVar11 = 0;
    local_b0 = lVar6;
    local_98 = lVar12;
    do {
      if (p_Var8->blkidx[lVar11] == lVar6) {
        local_a8 = lVar11;
        if (p_Var8->idx_size == 4) {
          pnga_sprs_array_access_col_block(local_50,lVar6,&local_b8,&local_c0,&local_80);
          lVar7 = local_80;
          lVar4 = local_c0;
          lVar6 = local_b0;
          lVar11 = local_a8;
          lVar12 = local_98;
          if (IVar10 <= local_c8) {
            local_d0 = local_b8;
            lVar9 = IVar10;
            do {
              lVar11 = lVar9 - IVar10;
              iVar2 = *(int *)(local_d0 + lVar11 * 4);
              lVar12 = (long)iVar2;
              iVar3 = *(int *)(local_d0 + 4 + lVar11 * 4);
              if (iVar2 < iVar3) {
                do {
                  if (*(int *)(lVar4 + lVar12 * 4) == local_88) {
                    sVar1 = *(size_t *)((long)&SPA->size + local_98);
                    memcpy((void *)(sVar1 * lVar11 + local_78),(void *)(sVar1 * lVar12 + lVar7),
                           sVar1);
                  }
                  lVar12 = lVar12 + 1;
                } while (iVar3 != lVar12);
              }
              bVar13 = lVar9 != local_c8;
              lVar6 = local_b0;
              IVar10 = local_a0;
              lVar11 = local_a8;
              lVar12 = local_98;
              lVar9 = lVar9 + 1;
            } while (bVar13);
          }
        }
        else {
          pnga_sprs_array_access_col_block(local_50,lVar6,&local_b8,&local_c0,&local_80);
          lVar7 = local_80;
          lVar4 = local_c0;
          lVar6 = local_b0;
          lVar11 = local_a8;
          lVar12 = local_98;
          if (IVar10 <= local_c8) {
            local_d0 = local_b8;
            lVar9 = IVar10;
            do {
              lVar6 = lVar9 - IVar10;
              lVar11 = *(long *)(local_d0 + lVar6 * 8);
              lVar12 = *(long *)(local_d0 + 8 + lVar6 * 8);
              if (lVar11 < lVar12) {
                do {
                  if (*(long *)(lVar4 + lVar11 * 8) == local_88) {
                    sVar1 = *(size_t *)((long)&SPA->size + local_98);
                    memcpy((void *)(sVar1 * lVar6 + local_78),(void *)(sVar1 * lVar11 + lVar7),sVar1
                          );
                  }
                  lVar11 = lVar11 + 1;
                } while (lVar12 != lVar11);
              }
              bVar13 = lVar9 != local_c8;
              lVar6 = local_b0;
              IVar10 = local_a0;
              lVar9 = lVar9 + 1;
              lVar11 = local_a8;
              lVar12 = local_98;
            } while (bVar13);
          }
        }
      }
      lVar11 = lVar11 + 1;
      p_Var8 = (_sparse_array *)((long)&SPA->idim + lVar12);
    } while (lVar11 < *(long *)((long)&SPA->nblocks + lVar12));
  }
  IVar5 = local_48;
  local_b8 = IVar10 + 1;
  local_c0 = local_68;
  pnga_release(local_48,&local_b8,&local_c0);
  free(local_60);
  free(local_90);
  if ((int)local_58 != 0) {
    pnga_pgroup_sync(*(Integer *)((long)&SPA->grp + lVar12));
  }
  return IVar5;
}

Assistant:

Integer pnga_sprs_array_get_column(Integer s_a, Integer icol)
{
  Integer g_v;
  Integer handle = s_a + GA_OFFSET;
  int local_sync_begin,local_sync_end;
  Integer type = SPA[handle].type;
  Integer one = 1;
  Integer idim = SPA[handle].idim;
  Integer nprocs = pnga_pgroup_nnodes(SPA[handle].grp);
  Integer me = pnga_pgroup_nodeid(SPA[handle].grp);
  Integer *size, *map;
  Integer i, j, n, hi, lo, ld;
  Integer iblock;
  void *ptr;
  char cplus[2];
  cplus[0] = '+';
  cplus[1] = '\0';

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(SPA[handle].grp);

  /* Create map array containing row offsets */
  hi = SPA[handle].ihi;
  lo = SPA[handle].ilo;
  size = (Integer*)malloc(nprocs*sizeof(Integer));
  map = (Integer*)malloc(nprocs*sizeof(Integer));
  for (i=0; i<nprocs; i++) size[i] = 0;
  size[me] = hi - lo + 1;
  if (sizeof(Integer) == sizeof(int)) {
    pnga_pgroup_gop(SPA[handle].grp,C_INT,size,nprocs,cplus);
  } else {
    pnga_pgroup_gop(SPA[handle].grp,C_LONG,size,nprocs,cplus);
  }
  map[0] = 1;
  for (i=1; i<nprocs; i++) map[i] = map[i-1]+size[i-1];

  /* create column vector array and set it to zero */
  pnga_mask_sync(local_sync_begin,local_sync_end);
  g_v = pnga_create_handle();
  pnga_set_data(g_v,one,&idim,type);
  pnga_set_pgroup(g_v,SPA[handle].grp);
  pnga_set_irreg_distr(g_v,map,&nprocs);
  pnga_mask_sync(local_sync_begin,local_sync_end);
  pnga_allocate(g_v);
  pnga_mask_sync(local_sync_begin,local_sync_end);
  pnga_zero(g_v);
  if (hi >= lo) {
    Integer ilo = lo+1;
    Integer ihi = hi+1;
    pnga_access_ptr(g_v,&ilo,&ihi,&ptr,&ld);
  } else {
    ptr = NULL;
  }
  /* Find column block that contains value icol. Scan through all non-zero
   * in this block and if j-index corresponds to icol, then set corresponding
   * value in g_v
   */
  iblock = (icol*nprocs)/SPA[handle].jdim;
  for (n=0; n<SPA[handle].nblocks; n++) {
    if (SPA[handle].blkidx[n] == iblock) {
      if (SPA[handle].idx_size == sizeof(int)) {
        int *iptr, *jptr;
        void *vptr;
        pnga_sprs_array_access_col_block(s_a, iblock, &iptr, &jptr, &vptr);
        for (i=lo; i<=hi; i++) {
          Integer ilo, ihi;
          Integer idx = i-lo;
          ilo = iptr[idx];
          ihi = iptr[idx+1];
          for (j=ilo; j<ihi; j++) {
            if (jptr[j] == icol) {
              char *vt = (char*)vptr+j*SPA[handle].size;
              char *pt = (char*)ptr+idx*SPA[handle].size;
              memcpy(pt, vt, SPA[handle].size);
            }
          }
        }
      } else {
        int64_t *iptr, *jptr;
        void *vptr;
        pnga_sprs_array_access_col_block(s_a, iblock, &iptr, &jptr, &vptr);
        for (i=lo; i<=hi; i++) {
          Integer ilo, ihi;
          Integer idx = i-lo;
          ilo = iptr[idx];
          ihi = iptr[idx+1];
          for (j=ilo; j<ihi; j++) {
            if (jptr[j] == icol) {
              char *vt = (char*)vptr+j*SPA[handle].size;
              char *pt = (char*)ptr+idx*SPA[handle].size;
              memcpy(pt, vt, SPA[handle].size);
            }
          }
        }
      }
    }
  }
  {
    Integer ilo = lo+1;
    Integer ihi = hi+1;
    pnga_release(g_v,&ilo,&ihi);
  }
  free(map);
  free(size);
  if (local_sync_end) pnga_pgroup_sync(SPA[handle].grp);
  return g_v;
}